

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_5x5.h
# Opt level: O0

void ncnn::conv5x5s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float *pfVar51;
  float *pfVar52;
  float *pfVar53;
  float *pfVar54;
  float *pfVar55;
  float *pfVar56;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float sum_1;
  int remain_1;
  float sum2;
  float sum;
  int remain;
  int i;
  float *k4;
  float *k3;
  float *k2;
  float *k1;
  float *k0;
  float *r5;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  float *kernel0;
  float *img0;
  float *outptr2;
  float *outptr;
  int q;
  float bias0;
  Mat out;
  int p;
  float *bias;
  float *kernel;
  int outch;
  int outh;
  int outw;
  int inch;
  int w;
  float *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  float in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  int iVar57;
  int local_170;
  int local_16c;
  float *local_140;
  float *local_138;
  float *local_130;
  float *local_128;
  float *local_120;
  float *local_118;
  Mat local_108;
  float *local_c8;
  float *local_c0;
  float *local_a8;
  int local_a0;
  float local_9c;
  Mat local_98;
  int local_54;
  float *local_50;
  float *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  
  local_2c = *(int *)(in_RDI + 0x2c);
  local_30 = *(int *)(in_RDI + 0x34);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_38 = *(int *)(in_RSI + 0x30);
  local_3c = *(int *)(in_RSI + 0x34);
  local_20 = in_RCX;
  local_48 = Mat::operator_cast_to_float_(in_RDX);
  local_50 = Mat::operator_cast_to_float_(local_20);
  for (local_54 = 0; local_54 < local_3c; local_54 = local_54 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    if (local_50 == (float *)0x0) {
      in_stack_fffffffffffffe7c = 0.0;
    }
    else {
      in_stack_fffffffffffffe7c = local_50[local_54];
    }
    local_9c = in_stack_fffffffffffffe7c;
    Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
              in_stack_fffffffffffffe7c);
    for (local_a0 = 0; local_a0 < local_30; local_a0 = local_a0 + 1) {
      in_stack_fffffffffffffe70 = Mat::operator_cast_to_float_(&local_98);
      local_c0 = in_stack_fffffffffffffe70 + local_34;
      local_a8 = in_stack_fffffffffffffe70;
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      pfVar51 = Mat::operator_cast_to_float_(&local_108);
      Mat::~Mat((Mat *)0x14a50e);
      pfVar52 = local_48 + (long)(local_54 * local_30 * 0x19) + (long)(local_a0 * 0x19);
      local_120 = pfVar51 + local_2c;
      local_128 = pfVar51 + (local_2c << 1);
      local_130 = pfVar51 + local_2c * 3;
      local_138 = pfVar51 + (local_2c << 2);
      local_140 = pfVar51 + local_2c * 5;
      pfVar53 = pfVar52 + 5;
      pfVar54 = pfVar52 + 10;
      pfVar55 = pfVar52 + 0xf;
      pfVar56 = pfVar52 + 0x14;
      local_118 = pfVar51;
      for (local_16c = 0; local_16c + 1 < local_38; local_16c = local_16c + 2) {
        for (local_170 = local_34; 0 < local_170; local_170 = local_170 + -1) {
          fVar1 = *local_120;
          fVar2 = *pfVar52;
          fVar3 = local_120[1];
          fVar4 = pfVar52[1];
          fVar5 = local_120[2];
          fVar6 = pfVar52[2];
          fVar7 = local_120[3];
          fVar8 = pfVar52[3];
          fVar9 = local_120[4];
          fVar10 = pfVar52[4];
          fVar11 = *local_128;
          fVar12 = *pfVar53;
          fVar13 = local_128[1];
          fVar14 = pfVar52[6];
          fVar15 = local_128[2];
          fVar16 = pfVar52[7];
          fVar17 = local_128[3];
          fVar18 = pfVar52[8];
          fVar19 = local_128[4];
          fVar20 = pfVar52[9];
          fVar21 = *local_130;
          fVar22 = *pfVar54;
          fVar23 = local_130[1];
          fVar24 = pfVar52[0xb];
          fVar25 = local_130[2];
          fVar26 = pfVar52[0xc];
          fVar27 = local_130[3];
          fVar28 = pfVar52[0xd];
          fVar29 = local_130[4];
          fVar30 = pfVar52[0xe];
          fVar31 = *local_138;
          fVar32 = *pfVar55;
          fVar33 = local_138[1];
          fVar34 = pfVar52[0x10];
          fVar35 = local_138[2];
          fVar36 = pfVar52[0x11];
          fVar37 = local_138[3];
          fVar38 = pfVar52[0x12];
          fVar39 = local_138[4];
          fVar40 = pfVar52[0x13];
          fVar41 = *local_140;
          fVar42 = *pfVar56;
          fVar43 = local_140[1];
          fVar44 = pfVar52[0x15];
          fVar45 = local_140[2];
          fVar46 = pfVar52[0x16];
          fVar47 = local_140[3];
          fVar48 = pfVar52[0x17];
          fVar49 = local_140[4];
          fVar50 = pfVar52[0x18];
          *local_a8 = local_138[4] * pfVar52[0x18] +
                      local_138[3] * pfVar52[0x17] +
                      local_138[2] * pfVar52[0x16] +
                      local_138[1] * pfVar52[0x15] +
                      *local_138 * *pfVar56 +
                      local_130[4] * pfVar52[0x13] +
                      local_130[3] * pfVar52[0x12] +
                      local_130[2] * pfVar52[0x11] +
                      local_130[1] * pfVar52[0x10] +
                      *local_130 * *pfVar55 +
                      local_128[4] * pfVar52[0xe] +
                      local_128[3] * pfVar52[0xd] +
                      local_128[2] * pfVar52[0xc] +
                      local_128[1] * pfVar52[0xb] +
                      *local_128 * *pfVar54 +
                      local_120[4] * pfVar52[9] +
                      local_120[3] * pfVar52[8] +
                      local_120[2] * pfVar52[7] +
                      local_120[1] * pfVar52[6] +
                      *local_120 * *pfVar53 +
                      local_118[4] * pfVar52[4] +
                      local_118[3] * pfVar52[3] +
                      local_118[2] * pfVar52[2] +
                      local_118[1] * pfVar52[1] + *local_118 * *pfVar52 + 0.0 + *local_a8;
          *local_c0 = fVar49 * fVar50 +
                      fVar47 * fVar48 +
                      fVar45 * fVar46 +
                      fVar43 * fVar44 +
                      fVar41 * fVar42 +
                      fVar39 * fVar40 +
                      fVar37 * fVar38 +
                      fVar35 * fVar36 +
                      fVar33 * fVar34 +
                      fVar31 * fVar32 +
                      fVar29 * fVar30 +
                      fVar27 * fVar28 +
                      fVar25 * fVar26 +
                      fVar23 * fVar24 +
                      fVar21 * fVar22 +
                      fVar19 * fVar20 +
                      fVar17 * fVar18 +
                      fVar15 * fVar16 +
                      fVar13 * fVar14 +
                      fVar11 * fVar12 +
                      fVar9 * fVar10 +
                      fVar7 * fVar8 + fVar5 * fVar6 + fVar3 * fVar4 + fVar1 * fVar2 + 0.0 +
                      *local_c0;
          local_118 = local_118 + 1;
          local_120 = local_120 + 1;
          local_128 = local_128 + 1;
          local_130 = local_130 + 1;
          local_138 = local_138 + 1;
          local_140 = local_140 + 1;
          local_a8 = local_a8 + 1;
          local_c0 = local_c0 + 1;
        }
        local_118 = local_118 + (local_2c + 4);
        local_120 = local_120 + (local_2c + 4);
        local_128 = local_128 + (local_2c + 4);
        local_130 = local_130 + (local_2c + 4);
        local_138 = local_138 + (local_2c + 4);
        local_140 = local_140 + (local_2c + 4);
        local_a8 = local_a8 + local_34;
        local_c0 = local_c0 + local_34;
      }
      for (; iVar57 = local_34, local_16c < local_38; local_16c = local_16c + 1) {
        for (; 0 < iVar57; iVar57 = iVar57 + -1) {
          in_stack_fffffffffffffe80 =
               local_138[4] * pfVar52[0x18] +
               local_138[3] * pfVar52[0x17] +
               local_138[2] * pfVar52[0x16] +
               local_138[1] * pfVar52[0x15] +
               *local_138 * *pfVar56 +
               local_130[4] * pfVar52[0x13] +
               local_130[3] * pfVar52[0x12] +
               local_130[2] * pfVar52[0x11] +
               local_130[1] * pfVar52[0x10] +
               *local_130 * *pfVar55 +
               local_128[4] * pfVar52[0xe] +
               local_128[3] * pfVar52[0xd] +
               local_128[2] * pfVar52[0xc] +
               local_128[1] * pfVar52[0xb] +
               *local_128 * *pfVar54 +
               local_120[4] * pfVar52[9] +
               local_120[3] * pfVar52[8] +
               local_120[2] * pfVar52[7] +
               local_120[1] * pfVar52[6] +
               *local_120 * *pfVar53 +
               local_118[4] * pfVar52[4] +
               local_118[3] * pfVar52[3] +
               local_118[2] * pfVar52[2] + local_118[1] * pfVar52[1] + *local_118 * *pfVar52 + 0.0;
          *local_a8 = in_stack_fffffffffffffe80 + *local_a8;
          local_118 = local_118 + 1;
          local_120 = local_120 + 1;
          local_128 = local_128 + 1;
          local_130 = local_130 + 1;
          local_138 = local_138 + 1;
          local_a8 = local_a8 + 1;
        }
        local_118 = local_118 + 4;
        local_120 = local_120 + 4;
        local_128 = local_128 + 4;
        local_130 = local_130 + 4;
        local_138 = local_138 + 4;
        in_stack_fffffffffffffe84 = iVar57;
      }
      local_c8 = pfVar51;
    }
    Mat::~Mat((Mat *)0x14b321);
  }
  return;
}

Assistant:

static void conv5x5s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q=0; q<inch; q++)
        {
            float* outptr = out;
            float* outptr2 = outptr + outw;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch*25  + q*25;

            const float* r0 = img0;
            const float* r1 = img0 + w;
            const float* r2 = img0 + w*2;
            const float* r3 = img0 + w*3;
            const float* r4 = img0 + w*4;
            const float* r5 = img0 + w*5;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 5;
            const float* k2 = kernel0 + 10;
            const float* k3 = kernel0 + 15;
            const float* k4 = kernel0 + 20;

            int i = 0;

            for (; i+1 < outh; i+=2)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;
                    float sum2 = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r0[3] * k0[3];
                    sum += r0[4] * k0[4];

                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r1[3] * k1[3];
                    sum += r1[4] * k1[4];

                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];
                    sum += r2[3] * k2[3];
                    sum += r2[4] * k2[4];

                    sum += r3[0] * k3[0];
                    sum += r3[1] * k3[1];
                    sum += r3[2] * k3[2];
                    sum += r3[3] * k3[3];
                    sum += r3[4] * k3[4];

                    sum += r4[0] * k4[0];
                    sum += r4[1] * k4[1];
                    sum += r4[2] * k4[2];
                    sum += r4[3] * k4[3];
                    sum += r4[4] * k4[4];

                    sum2 += r1[0] * k0[0];
                    sum2 += r1[1] * k0[1];
                    sum2 += r1[2] * k0[2];
                    sum2 += r1[3] * k0[3];
                    sum2 += r1[4] * k0[4];

                    sum2 += r2[0] * k1[0];
                    sum2 += r2[1] * k1[1];
                    sum2 += r2[2] * k1[2];
                    sum2 += r2[3] * k1[3];
                    sum2 += r2[4] * k1[4];

                    sum2 += r3[0] * k2[0];
                    sum2 += r3[1] * k2[1];
                    sum2 += r3[2] * k2[2];
                    sum2 += r3[3] * k2[3];
                    sum2 += r3[4] * k2[4];

                    sum2 += r4[0] * k3[0];
                    sum2 += r4[1] * k3[1];
                    sum2 += r4[2] * k3[2];
                    sum2 += r4[3] * k3[3];
                    sum2 += r4[4] * k3[4];

                    sum2 += r5[0] * k4[0];
                    sum2 += r5[1] * k4[1];
                    sum2 += r5[2] * k4[2];
                    sum2 += r5[3] * k4[3];
                    sum2 += r5[4] * k4[4];

                    *outptr += sum;
                    *outptr2 += sum2;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    r4++;
                    r5++;
                    outptr++;
                    outptr2++;
                }

                r0 += 4 + w;
                r1 += 4 + w;
                r2 += 4 + w;
                r3 += 4 + w;
                r4 += 4 + w;
                r5 += 4 + w;

                outptr += outw;
                outptr2 += outw;
            }

            for (; i < outh; i++)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r0[3] * k0[3];
                    sum += r0[4] * k0[4];

                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r1[3] * k1[3];
                    sum += r1[4] * k1[4];

                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];
                    sum += r2[3] * k2[3];
                    sum += r2[4] * k2[4];

                    sum += r3[0] * k3[0];
                    sum += r3[1] * k3[1];
                    sum += r3[2] * k3[2];
                    sum += r3[3] * k3[3];
                    sum += r3[4] * k3[4];

                    sum += r4[0] * k4[0];
                    sum += r4[1] * k4[1];
                    sum += r4[2] * k4[2];
                    sum += r4[3] * k4[3];
                    sum += r4[4] * k4[4];

                    *outptr += sum;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    r4++;
                    outptr++;
                }

                r0 += 4;
                r1 += 4;
                r2 += 4;
                r3 += 4;
                r4 += 4;

            }

        }
    }

}